

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_MaxPlayerAmmo(FParser *this)

{
  long lVar1;
  undefined8 *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  PClassAmmo *type;
  AInventory *pAVar6;
  undefined8 *puVar7;
  PClass *pPVar8;
  PClass *pPVar9;
  PClass *pPVar10;
  ulong uVar11;
  bool bVar12;
  DVector3 local_48;
  
  if (this->t_argc < 2) {
    script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
    return;
  }
  uVar3 = T_GetPlayerNum(this->t_argv);
  if ((uVar3 != 0xffffffff) && (type = T_GetAmmo(this->t_argv + 1), type != (PClassAmmo *)0x0)) {
    uVar11 = (ulong)uVar3;
    if (2 < this->t_argc) {
      pAVar6 = AActor::FindInventory((AActor *)(&players)[uVar11 * 0x54],(PClassActor *)type,false);
      iVar4 = intvalue(this->t_argv + 2);
      iVar5 = 0;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      if (pAVar6 == (AInventory *)0x0) {
        local_48.X = 0.0;
        local_48.Y = 0.0;
        local_48.Z = 0.0;
        pAVar6 = (AInventory *)AActor::StaticSpawn((PClassActor *)type,&local_48,NO_REPLACE,false);
        pAVar6->Amount = 0;
        (*(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x29])
                  (pAVar6,(&players)[uVar11 * 0x54]);
      }
      pAVar6->MaxAmount = iVar5;
      lVar1 = (&players)[uVar11 * 0x54];
      puVar2 = *(undefined8 **)(lVar1 + 0x3b0);
      if (puVar2 != (undefined8 *)0x0) {
        pPVar9 = ABackpackItem::RegistrationInfo.MyClass;
        if ((*(byte *)(puVar2 + 4) & 0x20) == 0) {
          do {
            puVar7 = puVar2;
            pPVar8 = (PClass *)puVar7[1];
            pPVar10 = pPVar9;
            if (pPVar8 == (PClass *)0x0) {
              pPVar8 = (PClass *)(**(code **)*puVar7)(puVar7);
              puVar7[1] = pPVar8;
              pPVar10 = ABackpackItem::RegistrationInfo.MyClass;
            }
            bVar12 = pPVar8 != (PClass *)0x0;
            if (pPVar8 != pPVar9 && bVar12) {
              do {
                pPVar8 = pPVar8->ParentClass;
                bVar12 = pPVar8 != (PClass *)0x0;
                if (pPVar8 == pPVar9) break;
              } while (pPVar8 != (PClass *)0x0);
            }
            if (bVar12) {
              if (this->t_argc < 4) {
                iVar5 = iVar5 * 2;
              }
              else {
                iVar5 = intvalue(this->t_argv + 3);
              }
              goto LAB_00509685;
            }
            puVar2 = (undefined8 *)puVar7[0x76];
            if (puVar2 == (undefined8 *)0x0) goto LAB_00509685;
            pPVar9 = pPVar10;
          } while ((*(byte *)(puVar2 + 4) & 0x20) == 0);
          puVar7[0x76] = 0;
        }
        else {
          *(undefined8 *)(lVar1 + 0x3b0) = 0;
        }
      }
LAB_00509685:
      *(int *)&pAVar6[1].super_AActor.super_DThinker.super_DObject._vptr_DObject = iVar5;
    }
    (this->t_return).type = 1;
    pAVar6 = AActor::FindInventory((AActor *)(&players)[uVar11 * 0x54],(PClassActor *)type,false);
    if (pAVar6 == (AInventory *)0x0) {
      pAVar6 = (AInventory *)(type->super_PClassInventory).super_PClassActor.super_PClass.Defaults;
    }
    (this->t_return).value.i = pAVar6->MaxAmount;
  }
  return;
}

Assistant:

void FParser::SF_MaxPlayerAmmo()
{
	int playernum, amount;
	PClassAmmo * ammotype;

	if (CheckArgs(2))
	{
		playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum==-1) return;

		ammotype=T_GetAmmo(t_argv[1]);
		if (!ammotype) return;

		if(t_argc == 2)
		{
		}
		else if(t_argc >= 3)
		{
			AAmmo * iammo = (AAmmo*)players[playernum].mo->FindInventory(ammotype);
			amount = intvalue(t_argv[2]);
			if(amount < 0) amount = 0;
			if (!iammo) 
			{
				iammo = static_cast<AAmmo *>(Spawn (ammotype));
				iammo->Amount = 0;
				iammo->AttachToOwner (players[playernum].mo);
			}
			iammo->MaxAmount = amount;


			for (AInventory *item = players[playernum].mo->Inventory; item != NULL; item = item->Inventory)
			{
				if (item->IsKindOf(RUNTIME_CLASS(ABackpackItem)))
				{
					if (t_argc>=4) amount = intvalue(t_argv[3]);
					else amount*=2;
					break;
				}
			}
			iammo->BackpackMaxAmount=amount;
		}

		t_return.type = svt_int;
		AInventory * iammo = players[playernum].mo->FindInventory(ammotype);
		if (iammo) t_return.value.i = iammo->MaxAmount;
		else t_return.value.i = ((AAmmo*)GetDefaultByType(ammotype))->MaxAmount;
	}
}